

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

optional<std::shared_ptr<DeclareStatementAstNode>_> * __thiscall
Parser::parseDeclareStatement
          (optional<std::shared_ptr<DeclareStatementAstNode>_> *__return_storage_ptr__,Parser *this)

{
  bool bVar1;
  TokenType type;
  byte local_1d9;
  shared_ptr<DeclareStatementAstNode> local_160;
  undefined4 local_150;
  allocator<char> local_149;
  string local_148 [32];
  undefined1 local_128 [16];
  undefined1 local_118 [8];
  optional<std::shared_ptr<ExpressionAstNode>_> expression;
  string local_f8 [32];
  undefined1 local_d8 [24];
  string local_c0 [32];
  undefined1 local_a0 [8];
  shared_ptr<Token> identifier;
  string local_88 [32];
  undefined1 local_68 [24];
  string local_50 [32];
  undefined1 local_30 [23];
  undefined1 local_19 [8];
  bool error;
  Parser *this_local;
  
  local_19[0] = (_Alloc_hider)0x0;
  unique0x1000058a = this;
  this_local = (Parser *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_50,"Expected a var",(allocator<char> *)(local_68 + 0x17));
  type = (TokenType)this;
  expect((Parser *)local_30,type,(bool *)0x11,(string *)local_19);
  std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_30);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)(local_68 + 0x17));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_88,"Expected whitespace following var declaration",
             (allocator<char> *)
             ((long)&identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  expect((Parser *)local_68,type,(bool *)0x4,(string *)local_19);
  std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_68);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  skipWhiteSpace(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c0,"Expected an identifier following var declaration",
             (allocator<char> *)(local_d8 + 0x17));
  expect((Parser *)local_a0,type,(bool *)0x18,(string *)local_19);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)(local_d8 + 0x17));
  skipWhiteSpace(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_f8,"Expected an equals following var declaration",
             (allocator<char> *)
             &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>.field_0x17);
  expect((Parser *)local_d8,type,(bool *)0x12,(string *)local_19);
  std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_d8);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>.field_0x17);
  parseExpression((optional<std::shared_ptr<ExpressionAstNode>_> *)local_118,this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_148,"Expected a semicolon following expression of var declaration",&local_149);
  expect((Parser *)local_128,type,(bool *)0x10,(string *)local_19);
  std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_128);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator(&local_149);
  local_1d9 = 1;
  if (((byte)local_19[0] & 1) == 0) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_a0);
    local_1d9 = 1;
    if (bVar1) {
      bVar1 = std::optional::operator_cast_to_bool((optional *)local_118);
      local_1d9 = bVar1 ^ 0xff;
    }
  }
  local_19[0] = (_Alloc_hider)(local_1d9 & 1);
  if (local_19[0] == (_Alloc_hider)0x0) {
    std::optional<std::shared_ptr<ExpressionAstNode>_>::value
              ((optional<std::shared_ptr<ExpressionAstNode>_> *)local_118);
    std::
    make_shared<DeclareStatementAstNode,std::shared_ptr<Token>&,std::shared_ptr<ExpressionAstNode>&>
              ((shared_ptr<Token> *)&local_160,(shared_ptr<ExpressionAstNode> *)local_a0);
    std::optional<std::shared_ptr<DeclareStatementAstNode>_>::
    optional<std::shared_ptr<DeclareStatementAstNode>,_true>(__return_storage_ptr__,&local_160);
    std::shared_ptr<DeclareStatementAstNode>::~shared_ptr(&local_160);
  }
  else {
    std::optional<std::shared_ptr<DeclareStatementAstNode>_>::optional(__return_storage_ptr__);
  }
  local_150 = 1;
  std::optional<std::shared_ptr<ExpressionAstNode>_>::~optional
            ((optional<std::shared_ptr<ExpressionAstNode>_> *)local_118);
  std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_a0);
  return __return_storage_ptr__;
}

Assistant:

const std::optional<std::shared_ptr<DeclareStatementAstNode>>
Parser::parseDeclareStatement() noexcept {
  bool error = false;

  this->expect(TokenType::Var, error, "Expected a var");

  this->expect(TokenType::WhiteSpace, error, "Expected whitespace following var declaration");

  this->skipWhiteSpace();

  auto identifier = this->expect(TokenType::Identifier, error,
    "Expected an identifier following var declaration");

  this->skipWhiteSpace();

  this->expect(TokenType::Assign, error, "Expected an equals following var declaration");

  auto expression = this->parseExpression();

  this->expect(TokenType::SemiColon, error,
    "Expected a semicolon following expression of var declaration");

  error = error || !identifier || !expression;

  if (error) { return std::nullopt; }

  return std::make_shared<DeclareStatementAstNode>(identifier, expression.value());
}